

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

Cycles __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>::perform_bus_operation
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true> *this,
          BusOperation operation,uint16_t address,uint8_t *value)

{
  uint uVar1;
  uint uVar2;
  pointer ppCVar3;
  _Head_base<0UL,_Apple::II::Card_*,_false> _Var4;
  Card *pCVar5;
  pointer puVar6;
  char *__name;
  ushort uVar7;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint8_t uVar8;
  bool bVar9;
  ulong uVar13;
  char cVar14;
  int iVar15;
  Card **card;
  pointer ppCVar16;
  long lVar17;
  WrappedInt<Cycles> offset;
  undefined8 uVar18;
  vector<Apple::II::Card*,std::allocator<Apple::II::Card*>> *this_00;
  uint uVar19;
  undefined8 uVar20;
  iterator __end4;
  iterator __begin4;
  float fVar21;
  float fVar22;
  Card *local_38;
  
  offset.length_ = (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ + 1;
  (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = offset.length_;
  (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ =
       (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ + 1;
  lVar17 = (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_;
  (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = lVar17 + 7;
  iVar15 = (this->cycles_into_current_line_ + 1) % 0x41;
  this->cycles_into_current_line_ = iVar15;
  if (iVar15 == 0) {
    (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = lVar17 + 8;
    this->stretched_cycles_since_card_update_ = this->stretched_cycles_since_card_update_ + 1;
  }
  __name = (char *)(ulong)address;
  uVar7 = address >> 8;
  uVar19 = (uint)address;
  if (this->read_pages_[uVar7] != (uint8_t *)0x0) {
    if ((int)operation < 5) {
      *value = this->read_pages_[uVar7][(ulong)address & 0xff];
    }
    else {
      if ((ushort)(address - 0x200) < 0x5e00) {
        update_video(this);
      }
      if (this->write_pages_[uVar7] != (uint8_t *)0x0) {
        this->write_pages_[uVar7][(ulong)address & 0xff] = *value;
      }
    }
    AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
    ::access(&this->auxiliary_switches_,__name,(uint)((int)operation < 5));
    goto LAB_00263a26;
  }
  if (address != 0xc000 && (int)operation < 5) {
    if ((this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_.
        super_DeferredQueue<Cycles>.pending_actions_.
        super__Vector_base<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_.
        super_DeferredQueue<Cycles>.pending_actions_.
        super__Vector_base<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      update_video(this);
      offset.length_ = (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    }
    uVar8 = II::Video::
            Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>::VideoBusHandler,_true>
            ::get_last_read_value(&this->video_,(Cycles)offset.length_);
    *value = uVar8;
  }
  bVar9 = SUB21(address,0);
  switch(address) {
  case 0xc030:
  case 0xc031:
  case 0xc032:
  case 0xc033:
  case 0xc034:
  case 0xc035:
  case 0xc036:
  case 0xc037:
  case 0xc038:
  case 0xc039:
  case 0xc03a:
  case 0xc03b:
  case 0xc03c:
  case 0xc03d:
  case 0xc03e:
  case 0xc03f:
    update_audio(this);
    bVar9 = Audio::Toggle::get_output(&this->audio_toggle_);
    Audio::Toggle::set_output(&this->audio_toggle_,!bVar9);
    break;
  case 0xc040:
  case 0xc041:
  case 0xc042:
  case 0xc043:
  case 0xc044:
  case 0xc045:
  case 0xc046:
  case 0xc047:
  case 0xc048:
  case 0xc049:
  case 0xc04a:
  case 0xc04b:
  case 0xc04c:
  case 0xc04d:
  case 0xc04e:
  case 0xc04f:
  case 0xc058:
  case 0xc059:
  case 0xc05a:
  case 0xc05b:
  case 0xc05c:
  case 0xc05d:
  case 0xc060:
  case 0xc061:
  case 0xc062:
  case 0xc063:
  case 0xc064:
  case 0xc065:
  case 0xc066:
  case 0xc067:
  case 0xc068:
  case 0xc069:
  case 0xc06a:
  case 0xc06b:
  case 0xc06c:
  case 0xc06d:
  case 0xc06e:
  case 0xc06f:
  case 0xc071:
  case 0xc072:
  case 0xc073:
  case 0xc074:
  case 0xc075:
  case 0xc076:
  case 0xc077:
  case 0xc078:
  case 0xc079:
  case 0xc07a:
  case 0xc07b:
  case 0xc07c:
  case 0xc07d:
  case 0xc07e:
  case 0xc07f:
switchD_002639a8_caseD_c040:
    if (4 < (int)operation) {
      AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
      ::access(&this->auxiliary_switches_,__name,0);
      uVar12 = address - 0xc000;
      if (uVar12 < 0x10) {
        if ((3U >> (uVar12 & 0x1f) & 1) == 0) {
          if ((0x3000U >> (uVar12 & 0x1f) & 1) == 0) {
            if ((0xc000U >> (uVar12 & 0x1f) & 1) != 0) {
              update_video(this);
              VideoSwitches<Cycles>::set_alternative_character_set
                        ((VideoSwitches<Cycles> *)&this->video_,(bool)(bVar9 & 1));
            }
          }
          else {
            update_video(this);
            VideoSwitches<Cycles>::set_80_columns
                      ((VideoSwitches<Cycles> *)&this->video_,(bool)(bVar9 & 1));
          }
        }
        else {
          update_video(this);
          (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.internal_.store_80 = bVar9;
          (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.store_80 = bVar9;
        }
      }
      break;
    }
    switch(uVar19) {
    case 0xc000:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      goto LAB_00263dac;
    case 0xc001:
    case 0xc002:
    case 0xc003:
    case 0xc004:
    case 0xc005:
    case 0xc006:
    case 0xc007:
    case 0xc008:
    case 0xc009:
    case 0xc00a:
    case 0xc00b:
    case 0xc00c:
    case 0xc00d:
    case 0xc00e:
    case 0xc00f:
      bVar10 = *value;
      bVar11 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar11 & 0x7f | bVar10 & 0x80;
    case 0xc010:
      goto switchD_00263de2_caseD_c010;
    case 0xc011:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->language_card_).state_.bank2;
      break;
    case 0xc012:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->language_card_).state_.read;
      break;
    case 0xc013:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->auxiliary_switches_).switches_.read_auxiliary_memory;
      break;
    case 0xc014:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      uVar2._0_1_ = (this->auxiliary_switches_).switches_.read_auxiliary_memory;
      uVar2._1_1_ = (this->auxiliary_switches_).switches_.write_auxiliary_memory;
      uVar2._2_1_ = (this->auxiliary_switches_).switches_.internal_CX_rom;
      uVar2._3_1_ = (this->auxiliary_switches_).switches_.slot_C3_rom;
      bVar11 = (byte)(uVar2 >> 1);
      goto LAB_00264126;
    case 0xc015:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      uVar1._0_1_ = (this->auxiliary_switches_).switches_.read_auxiliary_memory;
      uVar1._1_1_ = (this->auxiliary_switches_).switches_.write_auxiliary_memory;
      uVar1._2_1_ = (this->auxiliary_switches_).switches_.internal_CX_rom;
      uVar1._3_1_ = (this->auxiliary_switches_).switches_.slot_C3_rom;
      bVar11 = (byte)(uVar1 >> 9);
      goto LAB_00264126;
    case 0xc016:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      uVar13._0_1_ = (this->auxiliary_switches_).switches_.read_auxiliary_memory;
      uVar13._1_1_ = (this->auxiliary_switches_).switches_.write_auxiliary_memory;
      uVar13._2_1_ = (this->auxiliary_switches_).switches_.internal_CX_rom;
      uVar13._3_1_ = (this->auxiliary_switches_).switches_.slot_C3_rom;
      uVar13._4_1_ = (this->auxiliary_switches_).switches_.internal_C8_rom;
      uVar13._5_1_ = (this->auxiliary_switches_).switches_.store_80;
      uVar13._6_1_ = (this->auxiliary_switches_).switches_.alternative_zero_page;
      uVar13._7_1_ = (this->auxiliary_switches_).switches_.video_page_2;
      *value = (byte)(uVar13 >> 0x29) & 0x80 | bVar10 & 0x7f;
      goto switchD_00263de2_caseD_c010;
    case 0xc017:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      uVar12._0_1_ = (this->auxiliary_switches_).switches_.read_auxiliary_memory;
      uVar12._1_1_ = (this->auxiliary_switches_).switches_.write_auxiliary_memory;
      uVar12._2_1_ = (this->auxiliary_switches_).switches_.internal_CX_rom;
      uVar12._3_1_ = (this->auxiliary_switches_).switches_.slot_C3_rom;
      bVar11 = (byte)(uVar12 >> 0x11);
LAB_00264126:
      *value = bVar11 & 0x80 | bVar10;
      goto switchD_00263de2_caseD_c010;
    case 0xc018:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.store_80;
      break;
    case 0xc019:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      *value = ((((this->video_).super_VideoBase.column_ +
                  (int)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ + 0x19) /
                 0x41 + (this->video_).super_VideoBase.row_) % 0x106 < 0xc0) << 7 | bVar10 & 0x7f;
      goto switchD_00263de2_caseD_c010;
    case 0xc01a:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.text;
      break;
    case 0xc01b:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.mixed;
      break;
    case 0xc01c:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.page2;
      break;
    case 0xc01d:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.high_resolution;
      break;
    case 0xc01e:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.
               alternative_character_set;
      break;
    case 0xc01f:
      bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
      *value = bVar10;
      bVar10 = bVar10 & 0x7f;
      cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.columns_80;
      break;
    default:
      switch((uint)address) {
      case 0xc061:
        bVar10 = *value;
        *value = bVar10 & 0x7f;
        puVar6 = (this->joysticks_).joysticks_.
                 super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(char *)((long)(puVar6->_M_t).
                              super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                              ._M_t + 0x40) != '\0') ||
            (*(char *)((long)puVar6[1]._M_t.
                             super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                             ._M_t + 0x42) != '\0')) ||
           ((this->keyboard_).open_apple_is_pressed == true)) goto LAB_002642a7;
        break;
      case 0xc062:
        bVar10 = *value;
        *value = bVar10 & 0x7f;
        puVar6 = (this->joysticks_).joysticks_.
                 super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((*(char *)((long)(puVar6->_M_t).
                             super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                             ._M_t + 0x41) == '\0') &&
           (*(char *)((long)puVar6[1]._M_t.
                            super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                            ._M_t + 0x41) == '\0')) {
          cVar14 = (this->keyboard_).closed_apple_is_pressed;
joined_r0x00264223:
          if (cVar14 != '\x01') break;
        }
        goto LAB_002642a7;
      case 0xc063:
        bVar10 = *value;
        *value = bVar10 & 0x7f;
        puVar6 = (this->joysticks_).joysticks_.
                 super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)((long)(puVar6->_M_t).
                            super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                            ._M_t + 0x42) == '\0') {
          cVar14 = *(char *)((long)puVar6[1]._M_t.
                                   super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                                   ._M_t + 0x40);
          goto joined_r0x00264223;
        }
LAB_002642a7:
        bVar10 = bVar10 | 0x80;
LAB_00263dac:
        *value = bVar10;
        break;
      case 0xc064:
      case 0xc065:
      case 0xc066:
      case 0xc067:
        *value = *value & 0x7f;
        bVar9 = JoystickPair::analogue_channel_is_discharged
                          (&this->joysticks_,(ulong)(uVar19 - 0xc064));
        if (!bVar9) {
          *value = *value | 0x80;
        }
        break;
      default:
        if (uVar19 == 0xc07f) {
          bVar10 = *value & 0x7f;
          cVar14 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.
                   annunciator_3;
          goto LAB_002641e9;
        }
      }
      goto switchD_00263de2_caseD_c010;
    }
LAB_002641e9:
    *value = cVar14 << 7 | bVar10;
    break;
  case 0xc050:
  case 0xc051:
    update_video(this);
    VideoSwitches<Cycles>::set_text((VideoSwitches<Cycles> *)&this->video_,(bool)(bVar9 & 1));
    break;
  case 0xc052:
    update_video(this);
    bVar9 = false;
    goto LAB_00263e4d;
  case 0xc053:
    update_video(this);
    bVar9 = true;
LAB_00263e4d:
    VideoSwitches<Cycles>::set_mixed((VideoSwitches<Cycles> *)&this->video_,bVar9);
    break;
  case 0xc054:
  case 0xc055:
    update_video(this);
    (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.internal_.page2 = (bool)(bVar9 & 1U);
    (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.page2 = (bool)(bVar9 & 1U);
    goto LAB_00263d56;
  case 0xc056:
  case 0xc057:
    update_video(this);
    VideoSwitches<Cycles>::set_high_resolution
              ((VideoSwitches<Cycles> *)&this->video_,(bool)(bVar9 & 1));
LAB_00263d56:
    AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
    ::access(&this->auxiliary_switches_,__name,(uint)((int)operation < 5));
    break;
  case 0xc05e:
  case 0xc05f:
    update_video(this);
    VideoSwitches<Cycles>::set_annunciator_3
              ((VideoSwitches<Cycles> *)&this->video_,(address & 1) == 0);
    break;
  case 0xc070:
    JoystickPair::access_c070(&this->joysticks_);
    break;
  case 0xc080:
  case 0xc081:
  case 0xc082:
  case 0xc083:
  case 0xc084:
  case 0xc085:
  case 0xc086:
  case 0xc087:
  case 0xc088:
  case 0xc089:
  case 0xc08a:
  case 0xc08b:
  case 0xc08c:
  case 0xc08d:
  case 0xc08e:
  case 0xc08f:
    LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
    ::access(&this->language_card_,__name,(uint)((int)operation < 5));
    break;
  default:
    if (address != 0xc010) goto switchD_002639a8_caseD_c040;
    Keyboard::clear_keyboard_input(&this->keyboard_);
    if (4 < (int)operation) break;
    bVar9 = (this->keyboard_).key_is_down_;
    bVar10 = Keyboard::get_keyboard_input(&this->keyboard_);
    bVar10 = bVar10 & 0x7f | bVar9 << 7;
    goto LAB_00263dac;
  }
switchD_00263de2_caseD_c010:
  if (((ushort)(address + 0x3f70) < 0xf70) && (this->read_pages_[uVar7] == (uint8_t *)0x0)) {
    if (address < 0xc800) {
      if (address < 0xc100) {
        uVar20 = 1;
        uVar13 = (ulong)(uVar19 - 0xc090 >> 4);
      }
      else {
        uVar13 = (ulong)(uVar19 - 0xc100 >> 8);
        this->active_card_ = uVar13;
        uVar20 = 2;
      }
    }
    else {
      uVar13 = this->active_card_;
      uVar20 = 4;
      if (address == 0xcfff) {
        this->active_card_ = 7;
      }
    }
    _Var4._M_head_impl =
         (this->cards_)._M_elems[uVar13]._M_t.
         super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
         super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
         super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
    if ((_Var4._M_head_impl != (Card *)0x0) && ((_Var4._M_head_impl)->select_constraints_ != 0)) {
      update_just_in_time_cards(this);
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_Card + 0x20))
                (_Var4._M_head_impl,uVar20,(ulong)((int)operation < 5),__name,value);
    }
    ppCVar3 = (this->every_cycle_cards_).
              super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar16 = (this->every_cycle_cards_).
                    super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppCVar16 != ppCVar3;
        ppCVar16 = ppCVar16 + 1) {
      (*(*ppCVar16)->_vptr_Card[2])(*ppCVar16,1,(ulong)(iVar15 == 0));
      pCVar5 = *ppCVar16;
      uVar18 = 0;
      if (pCVar5 == _Var4._M_head_impl) {
        uVar18 = uVar20;
      }
      (*pCVar5->_vptr_Card[4])(pCVar5,uVar18,(ulong)((int)operation < 5),__name,value);
    }
  }
  else {
LAB_00263a26:
    ppCVar16 = (this->every_cycle_cards_).
               super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppCVar3 = (this->every_cycle_cards_).
              super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar16 != ppCVar3) {
      for (; ppCVar16 != ppCVar3; ppCVar16 = ppCVar16 + 1) {
        (*(*ppCVar16)->_vptr_Card[2])(*ppCVar16,1,(ulong)(iVar15 == 0));
        (*(*ppCVar16)->_vptr_Card[4])(*ppCVar16,0,(ulong)((int)operation < 5),__name,value);
      }
    }
  }
  if (this->card_lists_are_dirty_ == true) {
    this->card_lists_are_dirty_ = false;
    if (this->card_became_just_in_time_ == true) {
      this->card_became_just_in_time_ = false;
      update_just_in_time_cards(this);
    }
    ppCVar16 = (this->every_cycle_cards_).
               super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->every_cycle_cards_).
        super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar16) {
      (this->every_cycle_cards_).
      super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar16;
    }
    ppCVar16 = (this->just_in_time_cards_).
               super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->just_in_time_cards_).
        super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar16) {
      (this->just_in_time_cards_).
      super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar16;
    }
    for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 8) {
      local_38 = *(Card **)((long)&(this->cards_)._M_elems[0]._M_t.
                                   super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>
                                   .super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl +
                           lVar17);
      if (local_38 != (Card *)0x0) {
        this_00 = (vector<Apple::II::Card*,std::allocator<Apple::II::Card*>> *)
                  &this->every_cycle_cards_;
        if (local_38->select_constraints_ != 0) {
          this_00 = (vector<Apple::II::Card*,std::allocator<Apple::II::Card*>> *)
                    &this->just_in_time_cards_;
        }
        std::vector<Apple::II::Card*,std::allocator<Apple::II::Card*>>::
        emplace_back<Apple::II::Card*>(this_00,&local_38);
      }
    }
  }
  fVar21 = (this->joysticks_).analogue_charge_ + 0.00035460992;
  fVar22 = 1.1;
  if (fVar21 <= 1.1) {
    fVar22 = fVar21;
  }
  (this->joysticks_).analogue_charge_ = fVar22;
  return (Cycles)1;
}

Assistant:

forceinline Cycles perform_bus_operation(const CPU::MOS6502::BusOperation operation, const uint16_t address, uint8_t *const value) {
			++ cycles_since_video_update_;
			++ cycles_since_card_update_;
			cycles_since_audio_update_ += Cycles(7);

			// The Apple II has a slightly weird timing pattern: every 65th CPU cycle is stretched
			// by an extra 1/7th. That's because one cycle lasts 3.5 NTSC colour clocks, so after
			// 65 cycles a full line of 227.5 colour clocks have passed. But the high-rate binary
			// signal approximation that produces colour needs to be in phase, so a stretch of exactly
			// 0.5 further colour cycles is added. The video class handles that implicitly, but it
			// needs to be accumulated here for the audio.
			cycles_into_current_line_ = (cycles_into_current_line_ + 1) % 65;
			const bool is_stretched_cycle = !cycles_into_current_line_;
			if(is_stretched_cycle) {
				++ cycles_since_audio_update_;
				++ stretched_cycles_since_card_update_;
			}

			bool has_updated_cards = false;
			if(read_pages_[address >> 8]) {
				if(isReadOperation(operation)) *value = read_pages_[address >> 8][address & 0xff];
				else {
					if(address >= 0x200 && address < 0x6000) update_video();
					if(write_pages_[address >> 8]) write_pages_[address >> 8][address & 0xff] = *value;
				}

				if(is_iie(model)) {
					auxiliary_switches_.access(address, isReadOperation(operation));
				}
			} else {
				// Assume a vapour read unless it turns out otherwise; this is a little
				// wasteful but works for now.
				//
				// Longer version: like many other machines, when the Apple II reads from
				// an address at which no hardware loads the data bus, through a process of
				// practical analogue effects it'll end up receiving whatever was last on
				// the bus. Which will always be whatever the video circuit fetched because
				// that fetches in between every instruction.
				//
				// So this code assumes that'll happen unless it later determines that it
				// doesn't. The call into the video isn't free because it's a just-in-time
				// actor, but this will actually be the result most of the time so it's not
				// too terrible.
				if(isReadOperation(operation) && address != 0xc000) {
					// Ensure any enqueued video changes are applied before grabbing the
					// vapour value.
					if(video_.has_deferred_actions()) {
						update_video();
					}
					*value = video_.get_last_read_value(cycles_since_video_update_);
				}

				switch(address) {
					default:
						if(isReadOperation(operation)) {
							// Read-only switches.
							switch(address) {
								default: break;

								case 0xc000:
									*value = keyboard_.get_keyboard_input();
								break;
								case 0xc001: case 0xc002: case 0xc003: case 0xc004: case 0xc005: case 0xc006: case 0xc007:
								case 0xc008: case 0xc009: case 0xc00a: case 0xc00b: case 0xc00c: case 0xc00d: case 0xc00e: case 0xc00f:
									*value = (*value & 0x80) | (keyboard_.get_keyboard_input() & 0x7f);
								break;

								case 0xc061:	// Switch input 0.
									*value &= 0x7f;
									if(
										joysticks_.button(0) ||
										(is_iie(model) && keyboard_.open_apple_is_pressed)
									)
										*value |= 0x80;
								break;
								case 0xc062:	// Switch input 1.
									*value &= 0x7f;
									if(
										joysticks_.button(1) ||
										(is_iie(model) && keyboard_.closed_apple_is_pressed)
									)
										*value |= 0x80;
								break;
								case 0xc063:	// Switch input 2.
									*value &= 0x7f;
									if(joysticks_.button(2))
										*value |= 0x80;
								break;

								case 0xc064:	// Analogue input 0.
								case 0xc065:	// Analogue input 1.
								case 0xc066:	// Analogue input 2.
								case 0xc067: {	// Analogue input 3.
									const size_t input = address - 0xc064;
									*value &= 0x7f;
									if(!joysticks_.analogue_channel_is_discharged(input)) {
										*value |= 0x80;
									}
								} break;

								// The IIe-only state reads follow...
#define IIeSwitchRead(s)	*value = keyboard_.get_keyboard_input(); if(is_iie(model)) *value = (*value & 0x7f) | (s ? 0x80 : 0x00);
								case 0xc011:	IIeSwitchRead(language_card_.state().bank2);								break;
								case 0xc012:	IIeSwitchRead(language_card_.state().read);									break;
								case 0xc013:	IIeSwitchRead(auxiliary_switches_.switches().read_auxiliary_memory);		break;
								case 0xc014:	IIeSwitchRead(auxiliary_switches_.switches().write_auxiliary_memory);		break;
								case 0xc015:	IIeSwitchRead(auxiliary_switches_.switches().internal_CX_rom);				break;
								case 0xc016:	IIeSwitchRead(auxiliary_switches_.switches().alternative_zero_page);		break;
								case 0xc017:	IIeSwitchRead(auxiliary_switches_.switches().slot_C3_rom);					break;
								case 0xc018:	IIeSwitchRead(video_.get_80_store());										break;
								case 0xc019:	IIeSwitchRead(video_.get_is_vertical_blank(cycles_since_video_update_));	break;
								case 0xc01a:	IIeSwitchRead(video_.get_text());											break;
								case 0xc01b:	IIeSwitchRead(video_.get_mixed());											break;
								case 0xc01c:	IIeSwitchRead(video_.get_page2());											break;
								case 0xc01d:	IIeSwitchRead(video_.get_high_resolution());								break;
								case 0xc01e:	IIeSwitchRead(video_.get_alternative_character_set());						break;
								case 0xc01f:	IIeSwitchRead(video_.get_80_columns());										break;
#undef IIeSwitchRead

								case 0xc07f:
									if(is_iie(model)) *value = (*value & 0x7f) | (video_.get_annunciator_3() ? 0x80 : 0x00);
								break;
							}
						} else {
							// Write-only switches. All IIe as currently implemented.
							if(is_iie(model)) {
								auxiliary_switches_.access(address, false);
								switch(address) {
									default: break;

									case 0xc000:
									case 0xc001:
										update_video();
										video_.set_80_store(address&1);
									break;

									case 0xc00c:
									case 0xc00d:
										update_video();
										video_.set_80_columns(address&1);
									break;

									case 0xc00e:
									case 0xc00f:
										update_video();
										video_.set_alternative_character_set(address&1);
									break;
								}
							}
						}
					break;

					case 0xc070: joysticks_.access_c070(); break;

					/* Switches triggered by reading or writing. */
					case 0xc050:
					case 0xc051:
						update_video();
						video_.set_text(address&1);
					break;
					case 0xc052:	update_video();		video_.set_mixed(false);		break;
					case 0xc053:	update_video();		video_.set_mixed(true);			break;
					case 0xc054:
					case 0xc055:
						update_video();
						video_.set_page2(address&1);
						auxiliary_switches_.access(address, isReadOperation(operation));
					break;
					case 0xc056:
					case 0xc057:
						update_video();
						video_.set_high_resolution(address&1);
						auxiliary_switches_.access(address, isReadOperation(operation));
					break;

					case 0xc05e:
					case 0xc05f:
						if(is_iie(model)) {
							update_video();
							video_.set_annunciator_3(!(address&1));
						}
					break;

					case 0xc010:
						keyboard_.clear_keyboard_input();

						// On the IIe, reading C010 returns additional key info.
						if(is_iie(model) && isReadOperation(operation)) {
							*value = (keyboard_.get_key_is_down() ? 0x80 : 0x00) | (keyboard_.get_keyboard_input() & 0x7f);
						}
					break;

					case 0xc030: case 0xc031: case 0xc032: case 0xc033: case 0xc034: case 0xc035: case 0xc036: case 0xc037:
					case 0xc038: case 0xc039: case 0xc03a: case 0xc03b: case 0xc03c: case 0xc03d: case 0xc03e: case 0xc03f:
						update_audio();
						audio_toggle_.set_output(!audio_toggle_.get_output());
					break;

					case 0xc080: case 0xc084: case 0xc088: case 0xc08c:
					case 0xc081: case 0xc085: case 0xc089: case 0xc08d:
					case 0xc082: case 0xc086: case 0xc08a: case 0xc08e:
					case 0xc083: case 0xc087: case 0xc08b: case 0xc08f:
						language_card_.access(address, isReadOperation(operation));
					break;
				}

				/*
					Communication with cards follows.
				*/

				if(!read_pages_[address >> 8] && address >= 0xc090 && address < 0xd000) {
					// If this is a card access, figure out which card is at play before determining
					// the totality of who needs messaging.
					size_t card_number = 0;
					Apple::II::Card::Select select = Apple::II::Card::None;

					if(address >= 0xc800) {
						/*
							Decode the 2kb area used for additional ROMs.
							This is shared by all cards.
						*/
						card_number = active_card_;
						select = Apple::II::Card::C8Region;

						// An access to $cfff will disable the active card.
						if(address == 0xcfff) {
							active_card_ = NoActiveCard;
						}
					} else if(address >= 0xc100) {
						/*
							Decode the area conventionally used by cards for ROMs:
								0xCn00 to 0xCnff: card n.

							This also sets the active card for the C8 region.
						*/
						active_card_ = card_number = (address - 0xc100) >> 8;
						select = Apple::II::Card::IO;
					} else {
						/*
							Decode the area conventionally used by cards for registers:
								C0n0 to C0nF: card n - 8.
						*/
						card_number = (address - 0xc090) >> 4;
						select = Apple::II::Card::Device;
					}

					// If the selected card is a just-in-time card, update the just-in-time cards,
					// and then message it specifically.
					const bool is_read = isReadOperation(operation);
					Apple::II::Card *const target = cards_[size_t(card_number)].get();
					if(target && !is_every_cycle_card(target)) {
						update_just_in_time_cards();
						target->perform_bus_operation(select, is_read, address, value);
					}

					// Update all the every-cycle cards regardless, but send them a ::None select if they're
					// not the one actually selected.
					for(const auto &card: every_cycle_cards_) {
						card->run_for(Cycles(1), is_stretched_cycle);
						card->perform_bus_operation(
							(card == target) ? select : Apple::II::Card::None,
							is_read, address, value);
					}
					has_updated_cards = true;
				}
			}

			if(!has_updated_cards && !every_cycle_cards_.empty()) {
				// Update all every-cycle cards and give them the cycle.
				const bool is_read = isReadOperation(operation);
				for(const auto &card: every_cycle_cards_) {
					card->run_for(Cycles(1), is_stretched_cycle);
					card->perform_bus_operation(Apple::II::Card::None, is_read, address, value);
				}
			}

			// Update the card lists if any mutations are due.
			if(card_lists_are_dirty_) {
				card_lists_are_dirty_ = false;

				// There's only one counter of time since update
				// for just-in-time cards. If something new is
				// transitioning, that needs to be zeroed.
				if(card_became_just_in_time_) {
					card_became_just_in_time_ = false;
					update_just_in_time_cards();
				}

				// Clear the two lists and repopulate.
				every_cycle_cards_.clear();
				just_in_time_cards_.clear();
				for(const auto &card: cards_) {
					if(!card) continue;
					if(is_every_cycle_card(card.get())) {
						every_cycle_cards_.push_back(card.get());
					} else {
						just_in_time_cards_.push_back(card.get());
					}
				}
			}

			// Update analogue charge level.
			joysticks_.update_charge();

			return Cycles(1);
		}